

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

int pybind11::detail::generic_type::getbuffer(PyObject *obj,Py_buffer *view,int flags)

{
  long *plVar1;
  long *plVar2;
  type_info *ptVar3;
  buffer_info *pbVar4;
  long lVar5;
  long *plVar6;
  
  ptVar3 = get_type_info(obj->ob_type);
  if (ptVar3 == (type_info *)0x0 || (obj == (PyObject *)0x0 || view == (Py_buffer *)0x0)) {
    if (view == (Py_buffer *)0x0) goto LAB_00115120;
  }
  else if (ptVar3->get_buffer != (_func_buffer_info_ptr_PyObject_ptr_void_ptr *)0x0) {
    view->suboffsets = (Py_ssize_t *)0x0;
    view->internal = (void *)0x0;
    view->shape = (Py_ssize_t *)0x0;
    view->strides = (Py_ssize_t *)0x0;
    view->readonly = 0;
    view->ndim = 0;
    view->format = (char *)0x0;
    view->len = 0;
    view->itemsize = 0;
    view->buf = (void *)0x0;
    view->obj = (PyObject *)0x0;
    pbVar4 = (*ptVar3->get_buffer)(obj,ptVar3->get_buffer_data);
    view->obj = obj;
    view->ndim = 1;
    view->internal = pbVar4;
    view->buf = *(void **)pbVar4;
    lVar5 = *(long *)(pbVar4 + 8);
    view->itemsize = lVar5;
    view->len = lVar5;
    plVar2 = *(long **)(pbVar4 + 0x48);
    plVar1 = *(long **)(pbVar4 + 0x40);
    for (plVar6 = plVar1; plVar6 != plVar2; plVar6 = plVar6 + 1) {
      lVar5 = lVar5 * *plVar6;
      view->len = lVar5;
    }
    if ((flags & 4U) != 0) {
      view->format = *(char **)(pbVar4 + 0x18);
    }
    if ((~flags & 0x18U) == 0) {
      view->ndim = *(int *)(pbVar4 + 0x38);
      view->strides = *(Py_ssize_t **)(pbVar4 + 0x58);
      view->shape = plVar1;
    }
    obj->ob_refcnt = obj->ob_refcnt + 1;
    return 0;
  }
  view->obj = (PyObject *)0x0;
LAB_00115120:
  PyErr_SetString(_PyExc_BufferError,"generic_type::getbuffer(): Internal error");
  return -1;
}

Assistant:

static int getbuffer(PyObject *obj, Py_buffer *view, int flags) {
        auto tinfo = detail::get_type_info(Py_TYPE(obj));
        if (view == nullptr || obj == nullptr || !tinfo || !tinfo->get_buffer) {
            if (view)
                view->obj = nullptr;
            PyErr_SetString(PyExc_BufferError, "generic_type::getbuffer(): Internal error");
            return -1;
        }
        memset(view, 0, sizeof(Py_buffer));
        buffer_info *info = tinfo->get_buffer(obj, tinfo->get_buffer_data);
        view->obj = obj;
        view->ndim = 1;
        view->internal = info;
        view->buf = info->ptr;
        view->itemsize = (ssize_t) info->itemsize;
        view->len = view->itemsize;
        for (auto s : info->shape)
            view->len *= s;
        if ((flags & PyBUF_FORMAT) == PyBUF_FORMAT)
            view->format = const_cast<char *>(info->format.c_str());
        if ((flags & PyBUF_STRIDES) == PyBUF_STRIDES) {
            view->ndim = (int) info->ndim;
            view->strides = (ssize_t *) &info->strides[0];
            view->shape = (ssize_t *) &info->shape[0];
        }
        Py_INCREF(view->obj);
        return 0;
    }